

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataTypeRegister.cpp
# Opt level: O3

void __thiscall Rml::DataTypeRegister::DataTypeRegister(DataTypeRegister *this)

{
  size_t *psVar1;
  TransformFuncRegister *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  String local_c8;
  _Any_data local_a8;
  code *local_98;
  code *local_90;
  _Any_data local_88;
  code *local_78;
  code *local_70;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  psVar1 = &(this->type_register).mMask;
  (this->type_register).mKeyVals = (Node *)psVar1;
  (this->type_register).mInfo = (uint8_t *)psVar1;
  (this->type_register).mNumElements = 0;
  (this->type_register).mMask = 0;
  (this->type_register).mMaxNumElementsAllowed = 0;
  (this->type_register).mInfoInc = 0x20;
  (this->type_register).mInfoHashShift = 0;
  this_00 = &this->transform_register;
  psVar1 = &(this->transform_register).transform_functions.mMask;
  (this->transform_register).transform_functions.mKeyVals = (Node *)psVar1;
  (this->transform_register).transform_functions.mInfo = (uint8_t *)psVar1;
  (this->transform_register).transform_functions.mNumElements = 0;
  (this->transform_register).transform_functions.mMask = 0;
  (this->transform_register).transform_functions.mMaxNumElementsAllowed = 0;
  (this->transform_register).transform_functions.mInfoInc = 0x20;
  (this->transform_register).transform_functions.mInfoHashShift = 0;
  paVar2 = &local_c8.field_2;
  local_c8._M_dataplus._M_p = (pointer)paVar2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"to_lower","");
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_30 = ::std::
             _Function_handler<Rml::Variant_(const_std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DataTypeRegister.cpp:39:42)>
             ::_M_invoke;
  local_38 = ::std::
             _Function_handler<Rml::Variant_(const_std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DataTypeRegister.cpp:39:42)>
             ::_M_manager;
  TransformFuncRegister::Register(this_00,&local_c8,(DataTransformFunc *)&local_48);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  local_c8._M_dataplus._M_p = (pointer)paVar2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"to_upper","");
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  local_50 = ::std::
             _Function_handler<Rml::Variant_(const_std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DataTypeRegister.cpp:48:42)>
             ::_M_invoke;
  local_58 = ::std::
             _Function_handler<Rml::Variant_(const_std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DataTypeRegister.cpp:48:42)>
             ::_M_manager;
  TransformFuncRegister::Register(this_00,&local_c8,(DataTransformFunc *)&local_68);
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  local_c8._M_dataplus._M_p = (pointer)paVar2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"format","");
  local_88._M_unused._M_object = (void *)0x0;
  local_88._8_8_ = 0;
  local_70 = ::std::
             _Function_handler<Rml::Variant_(const_std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DataTypeRegister.cpp:57:40)>
             ::_M_invoke;
  local_78 = ::std::
             _Function_handler<Rml::Variant_(const_std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DataTypeRegister.cpp:57:40)>
             ::_M_manager;
  TransformFuncRegister::Register(this_00,&local_c8,(DataTransformFunc *)&local_88);
  if (local_78 != (code *)0x0) {
    (*local_78)(&local_88,&local_88,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  local_c8._M_dataplus._M_p = (pointer)paVar2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"round","");
  local_a8._M_unused._M_object = (void *)0x0;
  local_a8._8_8_ = 0;
  local_90 = ::std::
             _Function_handler<Rml::Variant_(const_std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DataTypeRegister.cpp:95:39)>
             ::_M_invoke;
  local_98 = ::std::
             _Function_handler<Rml::Variant_(const_std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DataTypeRegister.cpp:95:39)>
             ::_M_manager;
  TransformFuncRegister::Register(this_00,&local_c8,(DataTransformFunc *)&local_a8);
  if (local_98 != (code *)0x0) {
    (*local_98)(&local_a8,&local_a8,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

DataTypeRegister::DataTypeRegister()
{
	// Add default transform functions.

	transform_register.Register("to_lower", [](const VariantList& arguments) -> Variant {
		if (arguments.size() != 1)
			return {};
		String value;
		if (!arguments[0].GetInto(value))
			return {};
		return Variant(StringUtilities::ToLower(std::move(value)));
	});

	transform_register.Register("to_upper", [](const VariantList& arguments) -> Variant {
		if (arguments.size() != 1)
			return {};
		String value;
		if (!arguments[0].GetInto(value))
			return {};
		return Variant(StringUtilities::ToUpper(value));
	});

	transform_register.Register("format", [](const VariantList& arguments) -> Variant {
		// Arguments in:
		//   0 : number     Number to format.
		//   1 : int[0,32]  Precision. Number of digits after the decimal point.
		//  [2]: bool       True to remove trailing zeros (default = false).
		if (arguments.empty() || arguments.size() > 3)
		{
			Log::Message(Log::LT_WARNING, "Transform function 'format' requires at least two arguments, at most three arguments.");
			return {};
		}
		int precision = 0;
		if (!arguments[1].GetInto(precision) || precision < 0 || precision > 32)
		{
			Log::Message(Log::LT_WARNING, "Transform function 'format': Second argument must be an integer in [0, 32].");
			return {};
		}
		bool remove_trailing_zeros = false;
		if (arguments.size() >= 3)
		{
			if (!arguments[2].GetInto(remove_trailing_zeros))
				return {};
		}

		double value = 0;
		if (!arguments[0].GetInto(value))
			return {};

		String format_specifier = String(remove_trailing_zeros ? "%#." : "%.") + ToString(precision) + 'f';
		String result;
		if (FormatString(result, format_specifier.c_str(), value) == 0)
			return {};

		if (remove_trailing_zeros)
			StringUtilities::TrimTrailingDotZeros(result);

		return Variant(std::move(result));
	});

	transform_register.Register("round", [](const VariantList& arguments) -> Variant {
		if (arguments.size() != 1)
			return {};
		double value;
		if (!arguments[0].GetInto(value))
			return {};
		return Variant(Math::Round(value));
	});
}